

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O3

void stbir__vertical_gather_with_6_coeffs_cont
               (float *outputp,float *vertical_coefficients,float **inputs,float *input0_end)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float *pfVar114;
  float *pfVar115;
  long lVar116;
  float *pfVar117;
  float *pfVar118;
  float *pfVar119;
  float *pfVar120;
  long lVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  
  pfVar114 = *inputs;
  pfVar118 = inputs[1];
  fVar126 = (float)*(undefined8 *)vertical_coefficients;
  fVar127 = (float)((ulong)*(undefined8 *)vertical_coefficients >> 0x20);
  pfVar117 = inputs[2];
  pfVar119 = inputs[3];
  pfVar120 = inputs[4];
  pfVar115 = inputs[5];
  fVar122 = (float)*(undefined8 *)(vertical_coefficients + 2);
  fVar123 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 2) >> 0x20);
  fVar124 = (float)*(undefined8 *)(vertical_coefficients + 4);
  fVar125 = (float)((ulong)*(undefined8 *)(vertical_coefficients + 4) >> 0x20);
  lVar121 = (long)input0_end - (long)pfVar114;
  if (0x3f < lVar121) {
    lVar116 = 0;
    do {
      pfVar1 = (float *)((long)outputp + lVar116);
      fVar9 = pfVar1[1];
      fVar10 = pfVar1[2];
      fVar11 = pfVar1[3];
      pfVar2 = (float *)((long)outputp + lVar116 + 0x10);
      fVar12 = *pfVar2;
      fVar13 = pfVar2[1];
      fVar14 = pfVar2[2];
      fVar15 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar116 + 0x20);
      fVar16 = *pfVar2;
      fVar17 = pfVar2[1];
      fVar18 = pfVar2[2];
      fVar19 = pfVar2[3];
      pfVar2 = (float *)((long)outputp + lVar116 + 0x30);
      fVar20 = *pfVar2;
      fVar21 = pfVar2[1];
      fVar22 = pfVar2[2];
      fVar23 = pfVar2[3];
      pfVar2 = (float *)((long)pfVar114 + lVar116);
      fVar24 = pfVar2[1];
      fVar25 = pfVar2[2];
      fVar26 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar114 + lVar116 + 0x10);
      fVar27 = *pfVar3;
      fVar28 = pfVar3[1];
      fVar29 = pfVar3[2];
      fVar30 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar114 + lVar116 + 0x20);
      fVar31 = *pfVar3;
      fVar32 = pfVar3[1];
      fVar33 = pfVar3[2];
      fVar34 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar114 + lVar116 + 0x30);
      fVar35 = *pfVar3;
      fVar36 = pfVar3[1];
      fVar37 = pfVar3[2];
      fVar38 = pfVar3[3];
      pfVar3 = (float *)((long)pfVar118 + lVar116);
      fVar39 = pfVar3[1];
      fVar40 = pfVar3[2];
      fVar41 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar118 + lVar116 + 0x10);
      fVar42 = *pfVar4;
      fVar43 = pfVar4[1];
      fVar44 = pfVar4[2];
      fVar45 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar118 + lVar116 + 0x20);
      fVar46 = *pfVar4;
      fVar47 = pfVar4[1];
      fVar48 = pfVar4[2];
      fVar49 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar118 + lVar116 + 0x30);
      fVar50 = *pfVar4;
      fVar51 = pfVar4[1];
      fVar52 = pfVar4[2];
      fVar53 = pfVar4[3];
      pfVar4 = (float *)((long)pfVar117 + lVar116);
      fVar54 = pfVar4[1];
      fVar55 = pfVar4[2];
      fVar56 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar117 + lVar116 + 0x10);
      fVar57 = *pfVar5;
      fVar58 = pfVar5[1];
      fVar59 = pfVar5[2];
      fVar60 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar117 + lVar116 + 0x20);
      fVar61 = *pfVar5;
      fVar62 = pfVar5[1];
      fVar63 = pfVar5[2];
      fVar64 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar117 + lVar116 + 0x30);
      fVar65 = *pfVar5;
      fVar66 = pfVar5[1];
      fVar67 = pfVar5[2];
      fVar68 = pfVar5[3];
      pfVar5 = (float *)((long)pfVar119 + lVar116);
      fVar69 = pfVar5[1];
      fVar70 = pfVar5[2];
      fVar71 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar119 + lVar116 + 0x10);
      fVar72 = *pfVar6;
      fVar73 = pfVar6[1];
      fVar74 = pfVar6[2];
      fVar75 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar119 + lVar116 + 0x20);
      fVar76 = *pfVar6;
      fVar77 = pfVar6[1];
      fVar78 = pfVar6[2];
      fVar79 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar119 + lVar116 + 0x30);
      fVar80 = *pfVar6;
      fVar81 = pfVar6[1];
      fVar82 = pfVar6[2];
      fVar83 = pfVar6[3];
      pfVar6 = (float *)((long)pfVar120 + lVar116);
      fVar84 = pfVar6[1];
      fVar85 = pfVar6[2];
      fVar86 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar120 + lVar116 + 0x10);
      fVar87 = *pfVar7;
      fVar88 = pfVar7[1];
      fVar89 = pfVar7[2];
      fVar90 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar120 + lVar116 + 0x20);
      fVar91 = *pfVar7;
      fVar92 = pfVar7[1];
      fVar93 = pfVar7[2];
      fVar94 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar120 + lVar116 + 0x30);
      fVar95 = *pfVar7;
      fVar96 = pfVar7[1];
      fVar97 = pfVar7[2];
      fVar98 = pfVar7[3];
      pfVar7 = (float *)((long)pfVar115 + lVar116);
      fVar99 = pfVar7[1];
      fVar100 = pfVar7[2];
      fVar101 = pfVar7[3];
      pfVar8 = (float *)((long)pfVar115 + lVar116 + 0x10);
      fVar102 = *pfVar8;
      fVar103 = pfVar8[1];
      fVar104 = pfVar8[2];
      fVar105 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar115 + lVar116 + 0x20);
      fVar106 = *pfVar8;
      fVar107 = pfVar8[1];
      fVar108 = pfVar8[2];
      fVar109 = pfVar8[3];
      pfVar8 = (float *)((long)pfVar115 + lVar116 + 0x30);
      fVar110 = *pfVar8;
      fVar111 = pfVar8[1];
      fVar112 = pfVar8[2];
      fVar113 = pfVar8[3];
      pfVar8 = (float *)((long)outputp + lVar116);
      *pfVar8 = *pfVar7 * fVar125 +
                *pfVar6 * fVar124 +
                *pfVar5 * fVar123 +
                *pfVar4 * fVar122 + *pfVar3 * fVar127 + *pfVar2 * fVar126 + *pfVar1;
      pfVar8[1] = fVar99 * fVar125 +
                  fVar84 * fVar124 +
                  fVar69 * fVar123 + fVar54 * fVar122 + fVar39 * fVar127 + fVar24 * fVar126 + fVar9;
      pfVar8[2] = fVar100 * fVar125 +
                  fVar85 * fVar124 +
                  fVar70 * fVar123 + fVar55 * fVar122 + fVar40 * fVar127 + fVar25 * fVar126 + fVar10
      ;
      pfVar8[3] = fVar101 * fVar125 +
                  fVar86 * fVar124 +
                  fVar71 * fVar123 + fVar56 * fVar122 + fVar41 * fVar127 + fVar26 * fVar126 + fVar11
      ;
      pfVar1 = (float *)((long)outputp + lVar116 + 0x10);
      *pfVar1 = fVar102 * fVar125 +
                fVar87 * fVar124 +
                fVar72 * fVar123 + fVar57 * fVar122 + fVar42 * fVar127 + fVar27 * fVar126 + fVar12;
      pfVar1[1] = fVar103 * fVar125 +
                  fVar88 * fVar124 +
                  fVar73 * fVar123 + fVar58 * fVar122 + fVar43 * fVar127 + fVar28 * fVar126 + fVar13
      ;
      pfVar1[2] = fVar104 * fVar125 +
                  fVar89 * fVar124 +
                  fVar74 * fVar123 + fVar59 * fVar122 + fVar44 * fVar127 + fVar29 * fVar126 + fVar14
      ;
      pfVar1[3] = fVar105 * fVar125 +
                  fVar90 * fVar124 +
                  fVar75 * fVar123 + fVar60 * fVar122 + fVar45 * fVar127 + fVar30 * fVar126 + fVar15
      ;
      pfVar1 = (float *)((long)outputp + lVar116 + 0x20);
      *pfVar1 = fVar106 * fVar125 +
                fVar91 * fVar124 +
                fVar76 * fVar123 + fVar61 * fVar122 + fVar46 * fVar127 + fVar31 * fVar126 + fVar16;
      pfVar1[1] = fVar107 * fVar125 +
                  fVar92 * fVar124 +
                  fVar77 * fVar123 + fVar62 * fVar122 + fVar47 * fVar127 + fVar32 * fVar126 + fVar17
      ;
      pfVar1[2] = fVar108 * fVar125 +
                  fVar93 * fVar124 +
                  fVar78 * fVar123 + fVar63 * fVar122 + fVar48 * fVar127 + fVar33 * fVar126 + fVar18
      ;
      pfVar1[3] = fVar109 * fVar125 +
                  fVar94 * fVar124 +
                  fVar79 * fVar123 + fVar64 * fVar122 + fVar49 * fVar127 + fVar34 * fVar126 + fVar19
      ;
      pfVar1 = (float *)((long)outputp + lVar116 + 0x30);
      *pfVar1 = fVar110 * fVar125 +
                fVar95 * fVar124 +
                fVar80 * fVar123 + fVar65 * fVar122 + fVar50 * fVar127 + fVar35 * fVar126 + fVar20;
      pfVar1[1] = fVar111 * fVar125 +
                  fVar96 * fVar124 +
                  fVar81 * fVar123 + fVar66 * fVar122 + fVar51 * fVar127 + fVar36 * fVar126 + fVar21
      ;
      pfVar1[2] = fVar112 * fVar125 +
                  fVar97 * fVar124 +
                  fVar82 * fVar123 + fVar67 * fVar122 + fVar52 * fVar127 + fVar37 * fVar126 + fVar22
      ;
      pfVar1[3] = fVar113 * fVar125 +
                  fVar98 * fVar124 +
                  fVar83 * fVar123 + fVar68 * fVar122 + fVar53 * fVar127 + fVar38 * fVar126 + fVar23
      ;
      lVar116 = lVar116 + 0x40;
      lVar121 = lVar121 + -0x40;
    } while (0x3f < lVar121);
    outputp = (float *)((long)outputp + lVar116);
    pfVar114 = (float *)((long)pfVar114 + lVar116);
    pfVar118 = (float *)((long)pfVar118 + lVar116);
    pfVar117 = (float *)((long)pfVar117 + lVar116);
    pfVar119 = (float *)((long)pfVar119 + lVar116);
    pfVar120 = (float *)((long)pfVar120 + lVar116);
    pfVar115 = (float *)((long)pfVar115 + lVar116);
  }
  if (0xf < lVar121) {
    lVar121 = (long)input0_end - (long)pfVar114;
    lVar116 = 0;
    do {
      pfVar1 = (float *)((long)outputp + lVar116);
      fVar9 = pfVar1[1];
      fVar10 = pfVar1[2];
      fVar11 = pfVar1[3];
      pfVar2 = (float *)((long)pfVar114 + lVar116);
      fVar12 = pfVar2[1];
      fVar13 = pfVar2[2];
      fVar14 = pfVar2[3];
      pfVar3 = (float *)((long)pfVar118 + lVar116);
      fVar15 = pfVar3[1];
      fVar16 = pfVar3[2];
      fVar17 = pfVar3[3];
      pfVar4 = (float *)((long)pfVar117 + lVar116);
      fVar18 = pfVar4[1];
      fVar19 = pfVar4[2];
      fVar20 = pfVar4[3];
      pfVar5 = (float *)((long)pfVar119 + lVar116);
      fVar21 = pfVar5[1];
      fVar22 = pfVar5[2];
      fVar23 = pfVar5[3];
      pfVar6 = (float *)((long)pfVar120 + lVar116);
      fVar24 = pfVar6[1];
      fVar25 = pfVar6[2];
      fVar26 = pfVar6[3];
      pfVar7 = (float *)((long)pfVar115 + lVar116);
      fVar27 = pfVar7[1];
      fVar28 = pfVar7[2];
      fVar29 = pfVar7[3];
      pfVar8 = (float *)((long)outputp + lVar116);
      *pfVar8 = *pfVar7 * fVar125 +
                *pfVar6 * fVar124 +
                *pfVar5 * fVar123 +
                *pfVar4 * fVar122 + *pfVar3 * fVar127 + *pfVar2 * fVar126 + *pfVar1;
      pfVar8[1] = fVar27 * fVar125 +
                  fVar24 * fVar124 +
                  fVar21 * fVar123 + fVar18 * fVar122 + fVar15 * fVar127 + fVar12 * fVar126 + fVar9;
      pfVar8[2] = fVar28 * fVar125 +
                  fVar25 * fVar124 +
                  fVar22 * fVar123 + fVar19 * fVar122 + fVar16 * fVar127 + fVar13 * fVar126 + fVar10
      ;
      pfVar8[3] = fVar29 * fVar125 +
                  fVar26 * fVar124 +
                  fVar23 * fVar123 + fVar20 * fVar122 + fVar17 * fVar127 + fVar14 * fVar126 + fVar11
      ;
      lVar116 = lVar116 + 0x10;
      lVar121 = lVar121 + -0x10;
    } while (0xf < lVar121);
    outputp = (float *)((long)outputp + lVar116);
    pfVar114 = (float *)((long)pfVar114 + lVar116);
    pfVar118 = (float *)((long)pfVar118 + lVar116);
    pfVar117 = (float *)((long)pfVar117 + lVar116);
    pfVar119 = (float *)((long)pfVar119 + lVar116);
    pfVar120 = (float *)((long)pfVar120 + lVar116);
    pfVar115 = (float *)((long)pfVar115 + lVar116);
  }
  if (pfVar114 < input0_end) {
    lVar121 = 0;
    do {
      pfVar1 = (float *)((long)pfVar114 + lVar121);
      *(float *)((long)outputp + lVar121) =
           *(float *)((long)pfVar115 + lVar121) * fVar125 +
           *(float *)((long)pfVar119 + lVar121) * fVar123 +
           *(float *)((long)pfVar118 + lVar121) * fVar127 +
           *(float *)((long)outputp + lVar121) + *pfVar1 * fVar126 +
           *(float *)((long)pfVar117 + lVar121) * fVar122 +
           *(float *)((long)pfVar120 + lVar121) * fVar124;
      lVar121 = lVar121 + 4;
    } while (pfVar1 + 1 < input0_end);
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_gather_with_,_coeffs)( float * outputp, float const * vertical_coefficients, float const ** inputs, float const * input0_end )
{
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = outputp;

  stbIF0( float const * input0 = inputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float const * input1 = inputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float const * input2 = inputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float const * input3 = inputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float const * input4 = inputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float const * input5 = inputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float const * input6 = inputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float const * input7 = inputs[7]; float c7s = vertical_coefficients[7]; )

#if ( STBIR__vertical_channels == 1 ) && !defined(STB_IMAGE_RESIZE_VERTICAL_CONTINUE)
  // check single channel one weight
  if ( ( c0s >= (1.0f-0.000001f) ) && ( c0s <= (1.0f+0.000001f) ) )
  {
    STBIR_MEMCPY( output, input0, (char*)input0_end - (char*)input0 );
    return;
  }
#endif

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output);

      // prefetch four loop iterations ahead (doesn't affect much for small resizes, but helps with big ones)
      stbIF0( stbir__prefetch( input0 + (16*stbir__simdfX_float_count) ); )
      stbIF1( stbir__prefetch( input1 + (16*stbir__simdfX_float_count) ); )
      stbIF2( stbir__prefetch( input2 + (16*stbir__simdfX_float_count) ); )
      stbIF3( stbir__prefetch( input3 + (16*stbir__simdfX_float_count) ); )
      stbIF4( stbir__prefetch( input4 + (16*stbir__simdfX_float_count) ); )
      stbIF5( stbir__prefetch( input5 + (16*stbir__simdfX_float_count) ); )
      stbIF6( stbir__prefetch( input6 + (16*stbir__simdfX_float_count) ); )
      stbIF7( stbir__prefetch( input7 + (16*stbir__simdfX_float_count) ); )

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output );      stbir__simdfX_load( o1, output+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( o3, output+(3*stbir__simdfX_float_count) );
              stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );                         stbir__simdfX_madd( o2, o2, r2, c0 );                             stbir__simdfX_madd( o3, o3, r3, c0 ); )
      #else
      stbIF0( stbir__simdfX_load( r0, input0 );      stbir__simdfX_load( r1, input0+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input0+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );                             stbir__simdfX_mult( o2, r2, c0 );                                 stbir__simdfX_mult( o3, r3, c0 );  )
      #endif

      stbIF1( stbir__simdfX_load( r0, input1 );      stbir__simdfX_load( r1, input1+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input1+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );                         stbir__simdfX_madd( o2, o2, r2, c1 );                             stbir__simdfX_madd( o3, o3, r3, c1 ); )
      stbIF2( stbir__simdfX_load( r0, input2 );      stbir__simdfX_load( r1, input2+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input2+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );                         stbir__simdfX_madd( o2, o2, r2, c2 );                             stbir__simdfX_madd( o3, o3, r3, c2 ); )
      stbIF3( stbir__simdfX_load( r0, input3 );      stbir__simdfX_load( r1, input3+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input3+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );                         stbir__simdfX_madd( o2, o2, r2, c3 );                             stbir__simdfX_madd( o3, o3, r3, c3 ); )
      stbIF4( stbir__simdfX_load( r0, input4 );      stbir__simdfX_load( r1, input4+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input4+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );                         stbir__simdfX_madd( o2, o2, r2, c4 );                             stbir__simdfX_madd( o3, o3, r3, c4 ); )
      stbIF5( stbir__simdfX_load( r0, input5 );      stbir__simdfX_load( r1, input5+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input5+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );                         stbir__simdfX_madd( o2, o2, r2, c5 );                             stbir__simdfX_madd( o3, o3, r3, c5 ); )
      stbIF6( stbir__simdfX_load( r0, input6 );      stbir__simdfX_load( r1, input6+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input6+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );                         stbir__simdfX_madd( o2, o2, r2, c6 );                             stbir__simdfX_madd( o3, o3, r3, c6 ); )
      stbIF7( stbir__simdfX_load( r0, input7 );      stbir__simdfX_load( r1, input7+stbir__simdfX_float_count );   stbir__simdfX_load( r2, input7+(2*stbir__simdfX_float_count) );   stbir__simdfX_load( r3, input7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );                         stbir__simdfX_madd( o2, o2, r2, c7 );                             stbir__simdfX_madd( o3, o3, r3, c7 ); )

      stbir__simdfX_store( output, o0 );             stbir__simdfX_store( output+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output+(2*stbir__simdfX_float_count), o2 );  stbir__simdfX_store( output+(3*stbir__simdfX_float_count), o3 );
      output += (4*stbir__simdfX_float_count);
      stbIF0( input0 += (4*stbir__simdfX_float_count); ) stbIF1( input1 += (4*stbir__simdfX_float_count); ) stbIF2( input2 += (4*stbir__simdfX_float_count); ) stbIF3( input3 += (4*stbir__simdfX_float_count); ) stbIF4( input4 += (4*stbir__simdfX_float_count); ) stbIF5( input5 += (4*stbir__simdfX_float_count); ) stbIF6( input6 += (4*stbir__simdfX_float_count); ) stbIF7( input7 += (4*stbir__simdfX_float_count); )
    }

    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output);

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output );   stbir__simdf_load( r0, input0 ); stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #else
      stbIF0( stbir__simdf_load( r0, input0 );  stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) ); )
      #endif
      stbIF1( stbir__simdf_load( r0, input1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) ); )
      stbIF2( stbir__simdf_load( r0, input2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) ); )
      stbIF3( stbir__simdf_load( r0, input3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) ); )
      stbIF4( stbir__simdf_load( r0, input4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) ); )
      stbIF5( stbir__simdf_load( r0, input5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) ); )
      stbIF6( stbir__simdf_load( r0, input6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) ); )
      stbIF7( stbir__simdf_load( r0, input7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) ); )

      stbir__simdf_store( output, o0 );
      output += 4;
      stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input0_end - (char*) input0 ) >= 16 )
  {
    float o0, o1, o2, o3;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; o1 = output[1] + input0[1] * c0s; o2 = output[2] + input0[2] * c0s; o3 = output[3] + input0[3] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; o1  = input0[1] * c0s; o2  = input0[2] * c0s; o3  = input0[3] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; o1 += input1[1] * c1s; o2 += input1[2] * c1s; o3 += input1[3] * c1s; )
    stbIF2( o0 += input2[0] * c2s; o1 += input2[1] * c2s; o2 += input2[2] * c2s; o3 += input2[3] * c2s; )
    stbIF3( o0 += input3[0] * c3s; o1 += input3[1] * c3s; o2 += input3[2] * c3s; o3 += input3[3] * c3s; )
    stbIF4( o0 += input4[0] * c4s; o1 += input4[1] * c4s; o2 += input4[2] * c4s; o3 += input4[3] * c4s; )
    stbIF5( o0 += input5[0] * c5s; o1 += input5[1] * c5s; o2 += input5[2] * c5s; o3 += input5[3] * c5s; )
    stbIF6( o0 += input6[0] * c6s; o1 += input6[1] * c6s; o2 += input6[2] * c6s; o3 += input6[3] * c6s; )
    stbIF7( o0 += input7[0] * c7s; o1 += input7[1] * c7s; o2 += input7[2] * c7s; o3 += input7[3] * c7s; )
    output[0] = o0; output[1] = o1; output[2] = o2; output[3] = o3;
    output += 4;
    stbIF0( input0 += 4; ) stbIF1( input1 += 4; ) stbIF2( input2 += 4; ) stbIF3( input3 += 4; ) stbIF4( input4 += 4; ) stbIF5( input5 += 4; ) stbIF6( input6 += 4; ) stbIF7( input7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input0 < input0_end )
  {
    float o0;
    STBIR_NO_UNROLL(output);
    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( o0 = output[0] + input0[0] * c0s; )
    #else
    stbIF0( o0  = input0[0] * c0s; )
    #endif
    stbIF1( o0 += input1[0] * c1s; )
    stbIF2( o0 += input2[0] * c2s; )
    stbIF3( o0 += input3[0] * c3s; )
    stbIF4( o0 += input4[0] * c4s; )
    stbIF5( o0 += input5[0] * c5s; )
    stbIF6( o0 += input6[0] * c6s; )
    stbIF7( o0 += input7[0] * c7s; )
    output[0] = o0;
    ++output;
    stbIF0( ++input0; ) stbIF1( ++input1; ) stbIF2( ++input2; ) stbIF3( ++input3; ) stbIF4( ++input4; ) stbIF5( ++input5; ) stbIF6( ++input6; ) stbIF7( ++input7; )
  }
}